

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O2

size_t adios2::core::engine::ssc::TotalDataSize(Dims *dims,size_t elementSize,ShapeID *shapeId)

{
  pointer puVar1;
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  switch(*shapeId) {
  case GlobalValue:
  case LocalValue:
    break;
  case GlobalArray:
  case LocalArray:
    for (puVar1 = (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar1 != (dims->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
      elementSize = elementSize * *puVar1;
    }
    break;
  default:
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"SscHelper",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"TotalDataSize",&local_8b);
    std::__cxx11::string::string((string *)&local_88,"ShapeID not supported",&local_8c);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    elementSize = 0;
  }
  return elementSize;
}

Assistant:

size_t TotalDataSize(const Dims &dims, const size_t elementSize, const ShapeID &shapeId)
{
    if (shapeId == ShapeID::GlobalArray || shapeId == ShapeID::LocalArray)
    {
        return std::accumulate(dims.begin(), dims.end(), elementSize, std::multiplies<size_t>());
    }
    else if (shapeId == ShapeID::GlobalValue || shapeId == ShapeID::LocalValue)
    {
        return elementSize;
    }
    helper::Throw<std::runtime_error>("Engine", "SscHelper", "TotalDataSize",
                                      "ShapeID not supported");
    return 0;
}